

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

bool __thiscall ctemplate::TemplateDictionary::Empty(TemplateDictionary *this)

{
  VariableDict *pVVar1;
  SectionDict *pSVar2;
  IncludeDict *pIVar3;
  bool bVar4;
  
  pVVar1 = this->variable_dict_;
  if (pVVar1 != (VariableDict *)0x0) {
    bVar4 = pVVar1->size_ == 0;
    if (pVVar1->size_ < 0) {
      bVar4 = *(long *)((long)&pVVar1->field_2 + 0x30) == 0;
    }
    if (!bVar4) {
      return false;
    }
  }
  pSVar2 = this->section_dict_;
  if (pSVar2 != (SectionDict *)0x0) {
    bVar4 = pSVar2->size_ == 0;
    if (pSVar2->size_ < 0) {
      bVar4 = *(long *)((long)&pSVar2->field_2 + 0x30) == 0;
    }
    if (bVar4) {
      return false;
    }
  }
  pIVar3 = this->include_dict_;
  if (pIVar3 != (IncludeDict *)0x0) {
    bVar4 = pIVar3->size_ == 0;
    if (pIVar3->size_ < 0) {
      bVar4 = *(long *)((long)&pIVar3->field_2 + 0x30) == 0;
    }
    if (bVar4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool TemplateDictionary::Empty() const {
  if ((variable_dict_ && !variable_dict_->empty()) ||
      (section_dict_ && section_dict_->empty()) ||
      (include_dict_ && include_dict_->empty())) {
    return false;
  }
  return true;
}